

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O2

void Cec_ManSimSavePattern(Cec_ManSim_t *p,int iPat)

{
  int *piVar1;
  Abc_Cex_t *pAVar2;
  void *pvVar3;
  uint i;
  uint uVar4;
  
  if (p->pCexComb != (Abc_Cex_t *)0x0) {
    __assert_fail("p->pCexComb == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                  ,0x20a,"void Cec_ManSimSavePattern(Cec_ManSim_t *, int)");
  }
  if ((-1 < iPat) && (iPat < p->nWords << 5)) {
    uVar4 = p->pAig->vCis->nSize;
    pAVar2 = (Abc_Cex_t *)
             calloc((long)(int)((((int)uVar4 >> 5) + 1) - (uint)((uVar4 & 0x1f) == 0)) * 4 + 0x14,1)
    ;
    p->pCexComb = pAVar2;
    pAVar2->iPo = p->iOut;
    pAVar2->nPis = uVar4;
    pAVar2->nBits = uVar4;
    for (i = 0; (int)i < (int)uVar4; i = i + 1) {
      pvVar3 = Vec_PtrEntry(p->vCiSimInfo,i);
      if ((*(uint *)((long)pvVar3 + (ulong)((uint)iPat >> 5) * 4) & 1 << ((byte)iPat & 0x1f)) != 0)
      {
        piVar1 = &p->pCexComb[1].iPo + (i >> 5);
        *piVar1 = *piVar1 | 1 << ((byte)i & 0x1f);
      }
      uVar4 = p->pAig->vCis->nSize;
    }
    return;
  }
  __assert_fail("iPat >= 0 && iPat < 32 * p->nWords",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                ,0x20b,"void Cec_ManSimSavePattern(Cec_ManSim_t *, int)");
}

Assistant:

void Cec_ManSimSavePattern( Cec_ManSim_t * p, int iPat )
{
    unsigned * pInfo;
    int i;
    assert( p->pCexComb == NULL );
    assert( iPat >= 0 && iPat < 32 * p->nWords );
    p->pCexComb = (Abc_Cex_t *)ABC_CALLOC( char, 
        sizeof(Abc_Cex_t) + sizeof(unsigned) * Abc_BitWordNum(Gia_ManCiNum(p->pAig)) );
    p->pCexComb->iPo = p->iOut;
    p->pCexComb->nPis = Gia_ManCiNum(p->pAig);
    p->pCexComb->nBits = Gia_ManCiNum(p->pAig);
    for ( i = 0; i < Gia_ManCiNum(p->pAig); i++ )
    {
        pInfo = (unsigned *)Vec_PtrEntry( p->vCiSimInfo, i );
        if ( Abc_InfoHasBit( pInfo, iPat ) )
            Abc_InfoSetBit( p->pCexComb->pData, i );
    }
}